

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,
          "sim %s\n\nUsage: sim [OPTIONS] GAMEID\n      --seed <n>          Seed  to use for random number generator\n      --iterations <n>    Number of iterations to perform.\n      --maxDepth <n>      Maximum depth to randomly crawl into a move tree before giving up\n      --threads <n>       Number of threads to use. Default is CPU core count\n      --json              Output winCount, numIterations, shortestWin and deck as JSON\n      --printSolution     Output a winning solution of moves in JSON\n  -h, --help              Output this help and exit\n  -V, --version           Output version and exit\n\n"
          ,"0.0.1");
  fprintf(_stderr,"Valid GAMEIDs:\n");
  print_games_list();
  exit(1);
}

Assistant:

static void usage(void)
{
	fprintf(stderr,
			"sim %s\n"
			"\n"
			"Usage: sim [OPTIONS] GAMEID\n"
			"      --seed <n>          Seed  to use for random number generator\n"
			"      --iterations <n>    Number of iterations to perform.\n"
			"      --maxDepth <n>      Maximum depth to randomly crawl into a move tree before giving up\n"
			"      --threads <n>       Number of threads to use. Default is CPU core count\n"
			"      --json              Output winCount, numIterations, shortestWin and deck as JSON\n"
			"      --printSolution     Output a winning solution of moves in JSON\n"
			"  -h, --help              Output this help and exit\n"
			"  -V, --version           Output version and exit\n"
			"\n", SIM_VERSION);
	fprintf(stderr, "Valid GAMEIDs:\n");
	print_games_list();
	exit(EXIT_FAILURE);
}